

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# global_csv_state.cpp
# Opt level: O3

void duckdb::FillScanErrorTable
               (InternalAppender *scan_appender,idx_t scan_idx,idx_t file_idx,CSVFileScan *file)

{
  map<duckdb::LogicalTypeId,_duckdb::CSVOption<duckdb::StrpTimeFormat>,_std::less<duckdb::LogicalTypeId>,_std::allocator<std::pair<const_duckdb::LogicalTypeId,_duckdb::CSVOption<duckdb::StrpTimeFormat>_>_>_>
  *this;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  uint value;
  const_reference pvVar3;
  ostream *poVar4;
  const_reference this_00;
  ulong uVar5;
  mapped_type *pmVar6;
  pointer pcVar7;
  undefined1 auVar8 [8];
  _Alloc_hider _Var9;
  size_type __n;
  string_t value_00;
  string_t value_01;
  string_t value_02;
  string_t value_03;
  string_t value_04;
  string_t value_05;
  string_t value_06;
  string_t value_07;
  string_t value_08;
  StrpTimeFormat date_format;
  string parameters;
  StrpTimeFormat timestamp_format;
  ostringstream columns;
  undefined4 uStack_4dc;
  undefined4 uStack_4d8;
  undefined4 uStack_4d4;
  uint local_4d0;
  undefined4 uStack_4cc;
  undefined4 uStack_4c8;
  undefined4 uStack_4c4;
  uint local_4c0;
  undefined4 uStack_4bc;
  undefined4 uStack_4b8;
  undefined4 uStack_4b4;
  uint local_4b0;
  undefined4 uStack_4ac;
  undefined4 uStack_4a8;
  undefined4 uStack_4a4;
  uint local_4a0;
  undefined4 uStack_49c;
  undefined4 uStack_498;
  undefined4 uStack_494;
  uint local_490;
  undefined4 uStack_48c;
  undefined4 uStack_488;
  undefined4 uStack_484;
  CSVReaderOptions *local_480;
  uint local_478;
  undefined4 uStack_474;
  undefined4 uStack_470;
  undefined4 local_46c;
  uint local_468;
  undefined4 uStack_464;
  undefined4 uStack_460;
  undefined4 local_45c;
  uint local_458;
  undefined4 uStack_454;
  undefined4 uStack_450;
  undefined4 local_44c;
  vector<duckdb::LogicalType,_true> *local_448;
  undefined1 local_440 [8];
  _Alloc_hider local_438;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_430;
  vector<duckdb::StrTimeSpecifier,_std::allocator<duckdb::StrTimeSpecifier>_> local_418;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_400 [24];
  idx_t local_3e8;
  vector<int,_std::allocator<int>_> local_3e0;
  LogicalType local_3c8;
  LogicalType local_3b0;
  LogicalType local_398;
  string local_380;
  undefined1 local_360 [8];
  _Alloc_hider local_358;
  uint local_350;
  char local_348 [16];
  vector<duckdb::StrTimeSpecifier,_std::allocator<duckdb::StrTimeSpecifier>_> local_338;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_320 [24];
  idx_t local_308;
  vector<int,_std::allocator<int>_> local_300;
  Value local_2e8;
  Value local_2a8;
  Value local_268;
  string local_228 [3];
  ios_base local_1b8 [264];
  Value local_b0;
  Value local_70;
  
  BaseAppender::BeginRow(&scan_appender->super_BaseAppender);
  BaseAppender::Append<unsigned_long>(&scan_appender->super_BaseAppender,scan_idx);
  BaseAppender::Append<unsigned_long>(&scan_appender->super_BaseAppender,file_idx);
  pcVar7 = (file->super_BaseFileReader).file.path._M_dataplus._M_p;
  local_490 = (uint)(file->super_BaseFileReader).file.path._M_string_length;
  if (local_490 < 0xd) {
    uStack_484 = 0;
    uStack_48c = 0;
    uStack_488 = 0;
    if (local_490 == 0) {
      pcVar7 = (pointer)0x0;
    }
    else {
      switchD_00b041bd::default(&uStack_48c,pcVar7,(ulong)(local_490 & 0xf));
      pcVar7 = (pointer)CONCAT44(uStack_484,uStack_488);
    }
  }
  else {
    uStack_48c = *(undefined4 *)pcVar7;
    uStack_488 = SUB84(pcVar7,0);
    uStack_484 = (undefined4)((ulong)pcVar7 >> 0x20);
  }
  value_00.value._4_1_ = (undefined1)uStack_48c;
  value_00.value._5_1_ = uStack_48c._1_1_;
  value_00.value._6_1_ = uStack_48c._2_1_;
  value_00.value._7_1_ = uStack_48c._3_1_;
  value_00.value.pointer.length = local_490;
  value_00.value.pointer.ptr = pcVar7;
  BaseAppender::Append<duckdb::string_t>(&scan_appender->super_BaseAppender,value_00);
  paVar1 = &local_228[0].field_2;
  pcVar7 = (file->options).dialect_options.state_machine_options.delimiter.value._M_dataplus._M_p;
  local_228[0]._M_dataplus._M_p = (pointer)paVar1;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)local_228,pcVar7,
             pcVar7 + (file->options).dialect_options.state_machine_options.delimiter.value.
                      _M_string_length);
  local_4a0 = (uint)local_228[0]._M_string_length;
  if ((uint)local_228[0]._M_string_length < 0xd) {
    uStack_494 = 0;
    uStack_49c = 0;
    uStack_498 = 0;
    if ((uint)local_228[0]._M_string_length == 0) {
      _Var9._M_p = (pointer)(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)0x0;
    }
    else {
      switchD_00b041bd::default
                (&uStack_49c,local_228[0]._M_dataplus._M_p,
                 (ulong)((uint)local_228[0]._M_string_length & 0xf));
      _Var9._M_p = (pointer)CONCAT44(uStack_494,uStack_498);
    }
  }
  else {
    uStack_49c = *(undefined4 *)local_228[0]._M_dataplus._M_p;
    uStack_498 = SUB84(local_228[0]._M_dataplus._M_p,0);
    uStack_494 = (undefined4)((ulong)local_228[0]._M_dataplus._M_p >> 0x20);
    _Var9._M_p = local_228[0]._M_dataplus._M_p;
  }
  value_01.value._4_1_ = (undefined1)uStack_49c;
  value_01.value._5_1_ = uStack_49c._1_1_;
  value_01.value._6_1_ = uStack_49c._2_1_;
  value_01.value._7_1_ = uStack_49c._3_1_;
  value_01.value.pointer.length = local_4a0;
  value_01.value.pointer.ptr = _Var9._M_p;
  BaseAppender::Append<duckdb::string_t>(&scan_appender->super_BaseAppender,value_01);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_228[0]._M_dataplus._M_p != paVar1) {
    operator_delete(local_228[0]._M_dataplus._M_p);
  }
  CSVOption<char>::FormatValueInternal_abi_cxx11_
            (local_228,&(file->options).dialect_options.state_machine_options.quote,
             &(file->options).dialect_options.state_machine_options.quote.value);
  local_4b0 = (uint)local_228[0]._M_string_length;
  if ((uint)local_228[0]._M_string_length < 0xd) {
    uStack_4a4 = 0;
    uStack_4ac = 0;
    uStack_4a8 = 0;
    if ((uint)local_228[0]._M_string_length == 0) {
      _Var9._M_p = (pointer)(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)0x0;
    }
    else {
      switchD_00b041bd::default
                (&uStack_4ac,local_228[0]._M_dataplus._M_p,
                 (ulong)((uint)local_228[0]._M_string_length & 0xf));
      _Var9._M_p = (pointer)CONCAT44(uStack_4a4,uStack_4a8);
    }
  }
  else {
    uStack_4ac = *(undefined4 *)local_228[0]._M_dataplus._M_p;
    uStack_4a8 = SUB84(local_228[0]._M_dataplus._M_p,0);
    uStack_4a4 = (undefined4)((ulong)local_228[0]._M_dataplus._M_p >> 0x20);
    _Var9._M_p = local_228[0]._M_dataplus._M_p;
  }
  value_02.value._4_1_ = (undefined1)uStack_4ac;
  value_02.value._5_1_ = uStack_4ac._1_1_;
  value_02.value._6_1_ = uStack_4ac._2_1_;
  value_02.value._7_1_ = uStack_4ac._3_1_;
  value_02.value.pointer.length = local_4b0;
  value_02.value.pointer.ptr = _Var9._M_p;
  BaseAppender::Append<duckdb::string_t>(&scan_appender->super_BaseAppender,value_02);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_228[0]._M_dataplus._M_p != paVar1) {
    operator_delete(local_228[0]._M_dataplus._M_p);
  }
  CSVOption<char>::FormatValueInternal_abi_cxx11_
            (local_228,&(file->options).dialect_options.state_machine_options.escape,
             &(file->options).dialect_options.state_machine_options.escape.value);
  local_4c0 = (uint)local_228[0]._M_string_length;
  if ((uint)local_228[0]._M_string_length < 0xd) {
    uStack_4b4 = 0;
    uStack_4bc = 0;
    uStack_4b8 = 0;
    if ((uint)local_228[0]._M_string_length == 0) {
      _Var9._M_p = (pointer)(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)0x0;
    }
    else {
      switchD_00b041bd::default
                (&uStack_4bc,local_228[0]._M_dataplus._M_p,
                 (ulong)((uint)local_228[0]._M_string_length & 0xf));
      _Var9._M_p = (pointer)CONCAT44(uStack_4b4,uStack_4b8);
    }
  }
  else {
    uStack_4bc = *(undefined4 *)local_228[0]._M_dataplus._M_p;
    uStack_4b8 = SUB84(local_228[0]._M_dataplus._M_p,0);
    uStack_4b4 = (undefined4)((ulong)local_228[0]._M_dataplus._M_p >> 0x20);
    _Var9._M_p = local_228[0]._M_dataplus._M_p;
  }
  value_03.value._4_1_ = (undefined1)uStack_4bc;
  value_03.value._5_1_ = uStack_4bc._1_1_;
  value_03.value._6_1_ = uStack_4bc._2_1_;
  value_03.value._7_1_ = uStack_4bc._3_1_;
  value_03.value.pointer.length = local_4c0;
  value_03.value.pointer.ptr = _Var9._M_p;
  BaseAppender::Append<duckdb::string_t>(&scan_appender->super_BaseAppender,value_03);
  local_480 = &file->options;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_228[0]._M_dataplus._M_p != paVar1) {
    operator_delete(local_228[0]._M_dataplus._M_p);
  }
  CSVReaderOptions::NewLineIdentifierToString_abi_cxx11_(local_228,local_480);
  local_4d0 = (uint)local_228[0]._M_string_length;
  if ((uint)local_228[0]._M_string_length < 0xd) {
    uStack_4c4 = 0;
    uStack_4cc = 0;
    uStack_4c8 = 0;
    if ((uint)local_228[0]._M_string_length == 0) {
      _Var9._M_p = (pointer)(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)0x0;
    }
    else {
      switchD_00b041bd::default
                (&uStack_4cc,local_228[0]._M_dataplus._M_p,
                 (ulong)((uint)local_228[0]._M_string_length & 0xf));
      _Var9._M_p = (pointer)CONCAT44(uStack_4c4,uStack_4c8);
    }
  }
  else {
    uStack_4cc = *(undefined4 *)local_228[0]._M_dataplus._M_p;
    uStack_4c8 = SUB84(local_228[0]._M_dataplus._M_p,0);
    uStack_4c4 = (undefined4)((ulong)local_228[0]._M_dataplus._M_p >> 0x20);
    _Var9._M_p = local_228[0]._M_dataplus._M_p;
  }
  value_04.value._4_1_ = (undefined1)uStack_4cc;
  value_04.value._5_1_ = uStack_4cc._1_1_;
  value_04.value._6_1_ = uStack_4cc._2_1_;
  value_04.value._7_1_ = uStack_4cc._3_1_;
  value_04.value.pointer.length = local_4d0;
  value_04.value.pointer.ptr = _Var9._M_p;
  BaseAppender::Append<duckdb::string_t>(&scan_appender->super_BaseAppender,value_04);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_228[0]._M_dataplus._M_p != paVar1) {
    operator_delete(local_228[0]._M_dataplus._M_p);
  }
  value = NumericCastImpl<unsigned_int,_unsigned_long,_false>::Convert
                    ((file->options).dialect_options.skip_rows.value);
  Value::UINTEGER(&local_70,value);
  BaseAppender::Append<duckdb::Value>(&scan_appender->super_BaseAppender,&local_70);
  Value::~Value(&local_70);
  Value::BOOLEAN(&local_b0,(file->options).dialect_options.header.value);
  BaseAppender::Append<duckdb::Value>(&scan_appender->super_BaseAppender,&local_b0);
  Value::~Value(&local_b0);
  ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_228);
  ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_228,"{",1);
  if ((file->types).super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
      super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      (file->types).super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
      super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
      super__Vector_impl_data._M_start) {
    local_448 = &file->types;
    __n = 0;
    do {
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_228,"\'",1);
      pvVar3 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
               ::operator[](&file->names,__n);
      poVar4 = ::std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_228,(pvVar3->_M_dataplus)._M_p,pvVar3->_M_string_length);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\': \'",4);
      this_00 = vector<duckdb::LogicalType,_true>::operator[](local_448,__n);
      LogicalType::ToString_abi_cxx11_((string *)local_440,this_00);
      poVar4 = ::std::__ostream_insert<char,std::char_traits<char>>
                         (poVar4,(char *)local_440,(long)local_438._M_p);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\'",1);
      if (local_440 != (undefined1  [8])&local_430) {
        operator_delete((void *)local_440);
      }
      uVar5 = ((long)(file->types).
                     super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                     super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                     _M_impl.super__Vector_impl_data._M_finish -
               (long)(file->types).
                     super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                     super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                     _M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555;
      if (__n != uVar5 - 1) {
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_228,",",1);
        uVar5 = ((long)(file->types).
                       super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                       super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)(file->types).
                       super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                       super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                       ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555;
      }
      __n = __n + 1;
    } while (__n < uVar5);
  }
  ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_228,"}",1);
  ::std::__cxx11::stringbuf::str();
  if ((uint)local_438._M_p < 0xd) {
    uStack_4d4 = 0;
    uStack_4dc = 0;
    uStack_4d8 = 0;
    if ((uint)local_438._M_p == 0) {
      auVar8 = (undefined1  [8])
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)0x0;
    }
    else {
      switchD_00b041bd::default(&uStack_4dc,(void *)local_440,(ulong)((uint)local_438._M_p & 0xf));
      auVar8 = (undefined1  [8])CONCAT44(uStack_4d4,uStack_4d8);
    }
  }
  else {
    uStack_4dc = *(undefined4 *)local_440;
    uStack_4d8 = local_440._0_4_;
    uStack_4d4 = local_440._4_4_;
    auVar8 = local_440;
  }
  value_05.value._4_1_ = (undefined1)uStack_4dc;
  value_05.value._5_1_ = uStack_4dc._1_1_;
  value_05.value._6_1_ = uStack_4dc._2_1_;
  value_05.value._7_1_ = uStack_4dc._3_1_;
  value_05.value.pointer.length = (uint)local_438._M_p;
  value_05.value.pointer.ptr = (char *)auVar8;
  BaseAppender::Append<duckdb::string_t>(&scan_appender->super_BaseAppender,value_05);
  if (local_440 != (undefined1  [8])&local_430) {
    operator_delete((void *)local_440);
  }
  this = &(file->options).dialect_options.date_format;
  pmVar6 = ::std::
           map<duckdb::LogicalTypeId,_duckdb::CSVOption<duckdb::StrpTimeFormat>,_std::less<duckdb::LogicalTypeId>,_std::allocator<std::pair<const_duckdb::LogicalTypeId,_duckdb::CSVOption<duckdb::StrpTimeFormat>_>_>_>
           ::operator[](this,&LogicalType::DATE);
  local_440 = (undefined1  [8])&PTR__StrTimeFormat_01983180;
  local_438._M_p = local_430._M_local_buf + 8;
  pcVar7 = (pmVar6->value).super_StrTimeFormat.format_specifier._M_dataplus._M_p;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_438,pcVar7,
             pcVar7 + (pmVar6->value).super_StrTimeFormat.format_specifier._M_string_length);
  ::std::vector<duckdb::StrTimeSpecifier,_std::allocator<duckdb::StrTimeSpecifier>_>::vector
            (&local_418,
             &(pmVar6->value).super_StrTimeFormat.specifiers.
              super_vector<duckdb::StrTimeSpecifier,_std::allocator<duckdb::StrTimeSpecifier>_>);
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(local_400,
           &(pmVar6->value).super_StrTimeFormat.literals.
            super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          );
  local_3e8 = (pmVar6->value).super_StrTimeFormat.constant_size;
  ::std::vector<int,_std::allocator<int>_>::vector
            (&local_3e0,
             &(pmVar6->value).super_StrTimeFormat.numeric_width.
              super_vector<int,_std::allocator<int>_>);
  local_440 = (undefined1  [8])&PTR__StrTimeFormat_019831f8;
  bVar2 = StrTimeFormat::Empty((StrTimeFormat *)local_440);
  if (bVar2) {
    LogicalType::LogicalType(&local_398,SQLNULL);
    Value::Value(&local_268,&local_398);
    BaseAppender::Append<duckdb::Value>(&scan_appender->super_BaseAppender,&local_268);
    Value::~Value(&local_268);
    LogicalType::~LogicalType(&local_398);
  }
  else {
    local_458 = local_430._M_allocated_capacity._0_4_;
    if ((uint)local_430._0_4_ < 0xd) {
      local_44c = 0;
      uStack_454 = 0;
      uStack_450 = 0;
      if (local_430._M_allocated_capacity._0_4_ == 0) {
        _Var9._M_p = (char *)0x0;
      }
      else {
        switchD_00b041bd::default
                  (&uStack_454,local_438._M_p,(ulong)(local_430._M_allocated_capacity._0_4_ & 0xf));
        _Var9._M_p = (char *)CONCAT44(local_44c,uStack_450);
      }
    }
    else {
      uStack_454 = *(undefined4 *)local_438._M_p;
      _Var9._M_p = local_438._M_p;
    }
    value_06.value._4_1_ = (undefined1)uStack_454;
    value_06.value._5_1_ = uStack_454._1_1_;
    value_06.value._6_1_ = uStack_454._2_1_;
    value_06.value._7_1_ = uStack_454._3_1_;
    value_06.value.pointer.length = local_458;
    value_06.value.pointer.ptr = _Var9._M_p;
    BaseAppender::Append<duckdb::string_t>(&scan_appender->super_BaseAppender,value_06);
  }
  pmVar6 = ::std::
           map<duckdb::LogicalTypeId,_duckdb::CSVOption<duckdb::StrpTimeFormat>,_std::less<duckdb::LogicalTypeId>,_std::allocator<std::pair<const_duckdb::LogicalTypeId,_duckdb::CSVOption<duckdb::StrpTimeFormat>_>_>_>
           ::operator[](this,&LogicalType::TIMESTAMP);
  local_360 = (undefined1  [8])&PTR__StrTimeFormat_01983180;
  local_358._M_p = local_348;
  pcVar7 = (pmVar6->value).super_StrTimeFormat.format_specifier._M_dataplus._M_p;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_358,pcVar7,
             pcVar7 + (pmVar6->value).super_StrTimeFormat.format_specifier._M_string_length);
  ::std::vector<duckdb::StrTimeSpecifier,_std::allocator<duckdb::StrTimeSpecifier>_>::vector
            (&local_338,
             &(pmVar6->value).super_StrTimeFormat.specifiers.
              super_vector<duckdb::StrTimeSpecifier,_std::allocator<duckdb::StrTimeSpecifier>_>);
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(local_320,
           &(pmVar6->value).super_StrTimeFormat.literals.
            super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          );
  local_308 = (pmVar6->value).super_StrTimeFormat.constant_size;
  ::std::vector<int,_std::allocator<int>_>::vector
            (&local_300,
             &(pmVar6->value).super_StrTimeFormat.numeric_width.
              super_vector<int,_std::allocator<int>_>);
  local_360 = (undefined1  [8])&PTR__StrTimeFormat_019831f8;
  bVar2 = StrTimeFormat::Empty((StrTimeFormat *)local_360);
  if (bVar2) {
    LogicalType::LogicalType(&local_3b0,SQLNULL);
    Value::Value(&local_2a8,&local_3b0);
    BaseAppender::Append<duckdb::Value>(&scan_appender->super_BaseAppender,&local_2a8);
    Value::~Value(&local_2a8);
    LogicalType::~LogicalType(&local_3b0);
  }
  else {
    local_468 = local_350;
    if (local_350 < 0xd) {
      local_45c = 0;
      uStack_464 = 0;
      uStack_460 = 0;
      if (local_350 == 0) {
        _Var9._M_p = (char *)0x0;
      }
      else {
        switchD_00b041bd::default(&uStack_464,local_358._M_p,(ulong)(local_350 & 0xf));
        _Var9._M_p = (char *)CONCAT44(local_45c,uStack_460);
      }
    }
    else {
      uStack_464 = *(undefined4 *)local_358._M_p;
      _Var9._M_p = local_358._M_p;
    }
    value_07.value._4_1_ = (undefined1)uStack_464;
    value_07.value._5_1_ = uStack_464._1_1_;
    value_07.value._6_1_ = uStack_464._2_1_;
    value_07.value._7_1_ = uStack_464._3_1_;
    value_07.value.pointer.length = local_468;
    value_07.value.pointer.ptr = _Var9._M_p;
    BaseAppender::Append<duckdb::string_t>(&scan_appender->super_BaseAppender,value_07);
  }
  if ((file->options).user_defined_parameters._M_t._M_impl.super__Rb_tree_header._M_node_count == 0)
  {
    LogicalType::LogicalType(&local_3c8,SQLNULL);
    Value::Value(&local_2e8,&local_3c8);
    BaseAppender::Append<duckdb::Value>(&scan_appender->super_BaseAppender,&local_2e8);
    Value::~Value(&local_2e8);
    LogicalType::~LogicalType(&local_3c8);
  }
  else {
    CSVReaderOptions::GetUserDefinedParameters_abi_cxx11_(&local_380,local_480);
    local_478 = (uint)local_380._M_string_length;
    if ((uint)local_380._M_string_length < 0xd) {
      local_46c = 0;
      uStack_474 = 0;
      uStack_470 = 0;
      if ((uint)local_380._M_string_length == 0) {
        _Var9._M_p = (pointer)0x0;
      }
      else {
        switchD_00b041bd::default
                  (&uStack_474,local_380._M_dataplus._M_p,
                   (ulong)((uint)local_380._M_string_length & 0xf));
        _Var9._M_p = (pointer)CONCAT44(local_46c,uStack_470);
      }
    }
    else {
      uStack_474 = *(undefined4 *)local_380._M_dataplus._M_p;
      _Var9._M_p = local_380._M_dataplus._M_p;
    }
    value_08.value._4_1_ = (undefined1)uStack_474;
    value_08.value._5_1_ = uStack_474._1_1_;
    value_08.value._6_1_ = uStack_474._2_1_;
    value_08.value._7_1_ = uStack_474._3_1_;
    value_08.value.pointer.length = local_478;
    value_08.value.pointer.ptr = _Var9._M_p;
    BaseAppender::Append<duckdb::string_t>(&scan_appender->super_BaseAppender,value_08);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_380._M_dataplus._M_p != &local_380.field_2) {
      operator_delete(local_380._M_dataplus._M_p);
    }
  }
  BaseAppender::EndRow(&scan_appender->super_BaseAppender);
  StrTimeFormat::~StrTimeFormat((StrTimeFormat *)local_360);
  StrTimeFormat::~StrTimeFormat((StrTimeFormat *)local_440);
  ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_228);
  ::std::ios_base::~ios_base(local_1b8);
  return;
}

Assistant:

void FillScanErrorTable(InternalAppender &scan_appender, idx_t scan_idx, idx_t file_idx, CSVFileScan &file) {
	CSVReaderOptions &options = file.options;
	// Add the row to the rejects table
	scan_appender.BeginRow();
	// 1. Scan Idx
	scan_appender.Append(scan_idx);
	// 2. File Idx
	scan_appender.Append(file_idx);
	// 3. File Path
	scan_appender.Append(string_t(file.GetFileName()));
	// 4. Delimiter
	scan_appender.Append(string_t(options.dialect_options.state_machine_options.delimiter.FormatValue()));
	// 5. Quote
	scan_appender.Append(string_t(options.dialect_options.state_machine_options.quote.FormatValue()));
	// 6. Escape
	scan_appender.Append(string_t(options.dialect_options.state_machine_options.escape.FormatValue()));
	// 7. NewLine Delimiter
	scan_appender.Append(string_t(options.NewLineIdentifierToString()));
	// 8. Skip Rows
	scan_appender.Append(Value::UINTEGER(NumericCast<uint32_t>(options.dialect_options.skip_rows.GetValue())));
	// 9. Has Header
	scan_appender.Append(Value::BOOLEAN(options.dialect_options.header.GetValue()));

	auto &types = file.GetTypes();
	auto &names = file.GetNames();

	// 10. List<Struct<Column-Name:Types>> {'col1': 'INTEGER', 'col2': 'VARCHAR'}
	std::ostringstream columns;
	columns << "{";
	for (idx_t i = 0; i < types.size(); i++) {
		columns << "'" << names[i] << "': '" << types[i].ToString() << "'";
		if (i != types.size() - 1) {
			columns << ",";
		}
	}
	columns << "}";
	scan_appender.Append(string_t(columns.str()));
	// 11. Date Format
	auto date_format = options.dialect_options.date_format[LogicalType::DATE].GetValue();
	if (!date_format.Empty()) {
		scan_appender.Append(string_t(date_format.format_specifier));
	} else {
		scan_appender.Append(Value());
	}

	// 12. Timestamp Format
	auto timestamp_format = options.dialect_options.date_format[LogicalType::TIMESTAMP].GetValue();
	if (!timestamp_format.Empty()) {
		scan_appender.Append(string_t(timestamp_format.format_specifier));
	} else {
		scan_appender.Append(Value());
	}

	// 13. The Extra User Arguments
	if (options.user_defined_parameters.empty()) {
		scan_appender.Append(Value());
	} else {
		auto parameters = options.GetUserDefinedParameters();
		scan_appender.Append(string_t(parameters));
	}
	// Finish the row to the rejects table
	scan_appender.EndRow();
}